

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintPlacement(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint local_1c;
  uint local_18;
  int nUndef;
  int nFixed;
  int i;
  Gia_Man_t *p_local;
  
  local_18 = 0;
  local_1c = 0;
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    for (nUndef = 0; iVar1 = Gia_ManObjNum(p), nUndef < iVar1; nUndef = nUndef + 1) {
      local_18 = ((uint)p->pPlacement[nUndef] & 1) + local_18;
      local_1c = ((uint)p->pPlacement[nUndef] >> 0x10 & 1) + local_1c;
    }
    uVar2 = Gia_ManObjNum(p);
    Abc_Print(1,"Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n",(ulong)uVar2,
              (ulong)local_18,(ulong)local_1c);
  }
  return;
}

Assistant:

void Gia_ManPrintPlacement( Gia_Man_t * p )
{
    int i, nFixed = 0, nUndef = 0;
    if ( p->pPlacement == NULL )
        return;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        nFixed += p->pPlacement[i].fFixed;
        nUndef += p->pPlacement[i].fUndef;
    }
    Abc_Print( 1, "Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n", Gia_ManObjNum(p), nFixed, nUndef );
}